

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O1

int ftellline(FILE *file)

{
  int iVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  uint uVar4;
  char line [1024];
  char acStack_438 [1032];
  
  lVar2 = ftell((FILE *)file);
  rewind((FILE *)file);
  iVar1 = (int)lVar2;
  uVar4 = 0;
  do {
    do {
      __s = fgets(acStack_438,0x400,(FILE *)file);
      if (__s == (char *)0x0) {
        fseek((FILE *)file,(long)iVar1,0);
        return -1;
      }
      sVar3 = strlen(__s);
    } while ((sVar3 == 0x3ff) && (__s[0x3fe] != '\n'));
    uVar4 = uVar4 + 1;
    lVar2 = ftell((FILE *)file);
  } while (lVar2 <= iVar1);
  iVar1 = fseek((FILE *)file,(long)iVar1,0);
  return -(uint)(iVar1 != 0) | uVar4;
}

Assistant:

inline int ftellline(FILE* file)
{ 
	int cur = 0, i = 0;
	char* r = NULL;
	char line[1024];

	cur = ftell(file);
	rewind(file);

	do
	{
		do
		{
			r = fgets(line, sizeof(line), file);
			if (r == NULL) 
			{
				// Go back to initial position.
				fseek(file, cur, SEEK_SET);
				return -1;
			}
		} while ((strlen(r) == sizeof(line)-1)&&(r[sizeof(line)-2] != '\n'));
		i++;
	} while (ftell(file) <= cur);

	// Go back to initial position.
	if (fseek(file, cur, SEEK_SET) != EXIT_SUCCESS) return -1;

	return i;
}